

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgMatrix.cpp
# Opt level: O1

dgMatrix * __thiscall
dgMatrix::operator*(dgMatrix *__return_storage_ptr__,dgMatrix *this,dgMatrix *B)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  bool bVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  uint uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  
  fVar35 = (B->m_front).super_dgTemplateVector<float>.m_x;
  fVar31 = (B->m_front).super_dgTemplateVector<float>.m_y;
  fVar1 = (this->m_front).super_dgTemplateVector<float>.m_x;
  fVar2 = (this->m_front).super_dgTemplateVector<float>.m_y;
  fVar3 = (B->m_up).super_dgTemplateVector<float>.m_x;
  auVar21 = vfmadd231ss_fma(ZEXT416((uint)(fVar3 * fVar2)),ZEXT416((uint)fVar1),
                            ZEXT416((uint)fVar35));
  fVar36 = (this->m_front).super_dgTemplateVector<float>.m_z;
  fVar4 = (B->m_right).super_dgTemplateVector<float>.m_x;
  auVar21 = vfmadd231ss_avx512f(auVar21,ZEXT416((uint)fVar36),ZEXT416((uint)fVar4));
  fVar5 = (this->m_front).super_dgTemplateVector<float>.m_w;
  fVar33 = (B->m_posit).super_dgTemplateVector<float>.m_x;
  auVar22 = vfmadd231ss_avx512f(auVar21,ZEXT416((uint)fVar5),ZEXT416((uint)fVar33));
  fVar6 = (B->m_up).super_dgTemplateVector<float>.m_y;
  auVar21 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * fVar2)),ZEXT416((uint)fVar1),
                            ZEXT416((uint)fVar31));
  fVar7 = (B->m_right).super_dgTemplateVector<float>.m_y;
  auVar21 = vfmadd231ss_avx512f(auVar21,ZEXT416((uint)fVar36),ZEXT416((uint)fVar7));
  fVar8 = (B->m_posit).super_dgTemplateVector<float>.m_y;
  auVar21 = vfmadd231ss_avx512f(auVar21,ZEXT416((uint)fVar5),ZEXT416((uint)fVar8));
  fVar32 = auVar21._0_4_;
  fVar9 = (B->m_front).super_dgTemplateVector<float>.m_z;
  fVar10 = (B->m_up).super_dgTemplateVector<float>.m_z;
  auVar21 = vmulss_avx512f(ZEXT416((uint)fVar2),ZEXT416((uint)fVar10));
  auVar21 = vfmadd231ss_fma(auVar21,ZEXT416((uint)fVar1),ZEXT416((uint)fVar9));
  fVar11 = (B->m_right).super_dgTemplateVector<float>.m_z;
  auVar21 = vfmadd231ss_avx512f(auVar21,ZEXT416((uint)fVar36),ZEXT416((uint)fVar11));
  fVar12 = (B->m_posit).super_dgTemplateVector<float>.m_z;
  auVar21 = vfmadd231ss_avx512f(auVar21,ZEXT416((uint)fVar5),ZEXT416((uint)fVar12));
  fVar34 = auVar21._0_4_;
  fVar13 = (B->m_front).super_dgTemplateVector<float>.m_w;
  fVar14 = (B->m_up).super_dgTemplateVector<float>.m_w;
  auVar21 = vmulss_avx512f(ZEXT416((uint)fVar2),ZEXT416((uint)fVar14));
  auVar21 = vfmadd231ss_avx512f(auVar21,ZEXT416((uint)fVar13),ZEXT416((uint)fVar1));
  fVar1 = (B->m_right).super_dgTemplateVector<float>.m_w;
  auVar21 = vfmadd231ss_avx512f(auVar21,ZEXT416((uint)fVar1),ZEXT416((uint)fVar36));
  fVar2 = (B->m_posit).super_dgTemplateVector<float>.m_w;
  auVar21 = vfmadd231ss_avx512f(auVar21,ZEXT416((uint)fVar2),ZEXT416((uint)fVar5));
  fVar36 = auVar21._0_4_;
  if ((((!NAN(fVar36)) && (!NAN(fVar34))) && (!NAN(fVar32))) &&
     ((((uint)ABS(auVar22._0_4_) < 0x7f800000 && ((uint)ABS(fVar32) < 0x7f800000)) &&
      (((uint)ABS(fVar34) < 0x7f800000 && ((uint)ABS(fVar36) < 0x7f800000)))))) {
    fVar5 = (this->m_up).super_dgTemplateVector<float>.m_x;
    fVar15 = (this->m_up).super_dgTemplateVector<float>.m_y;
    auVar29 = ZEXT416((uint)fVar3);
    auVar21 = vmulss_avx512f(auVar29,ZEXT416((uint)fVar15));
    auVar21 = vfmadd231ss_avx512f(auVar21,ZEXT416((uint)fVar5),ZEXT416((uint)fVar35));
    fVar3 = (this->m_up).super_dgTemplateVector<float>.m_z;
    auVar21 = vfmadd231ss_avx512f(auVar21,ZEXT416((uint)fVar3),ZEXT416((uint)fVar4));
    fVar16 = (this->m_up).super_dgTemplateVector<float>.m_w;
    auVar23 = vfmadd231ss_avx512f(auVar21,ZEXT416((uint)fVar16),ZEXT416((uint)fVar33));
    auVar30 = ZEXT416((uint)fVar6);
    auVar21 = vmulss_avx512f(auVar30,ZEXT416((uint)fVar15));
    auVar21 = vfmadd231ss_avx512f(auVar21,ZEXT416((uint)fVar5),ZEXT416((uint)fVar31));
    auVar21 = vfmadd231ss_avx512f(auVar21,ZEXT416((uint)fVar3),ZEXT416((uint)fVar7));
    auVar24 = vfmadd231ss_avx512f(auVar21,ZEXT416((uint)fVar16),ZEXT416((uint)fVar8));
    auVar21 = vmulss_avx512f(ZEXT416((uint)fVar10),ZEXT416((uint)fVar15));
    auVar21 = vfmadd231ss_avx512f(auVar21,ZEXT416((uint)fVar5),ZEXT416((uint)fVar9));
    auVar21 = vfmadd231ss_avx512f(auVar21,ZEXT416((uint)fVar3),ZEXT416((uint)fVar11));
    auVar25 = vfmadd231ss_avx512f(auVar21,ZEXT416((uint)fVar16),ZEXT416((uint)fVar12));
    auVar21 = vmulss_avx512f(ZEXT416((uint)fVar14),ZEXT416((uint)fVar15));
    auVar21 = vfmadd231ss_avx512f(auVar21,ZEXT416((uint)fVar13),ZEXT416((uint)fVar5));
    auVar21 = vfmadd231ss_avx512f(auVar21,ZEXT416((uint)fVar1),ZEXT416((uint)fVar3));
    auVar21 = vfmadd231ss_avx512f(auVar21,ZEXT416((uint)fVar2),ZEXT416((uint)fVar16));
    bVar17 = (auVar25._0_4_ & 0x7fffffff) < 0x7f800000;
    uVar20 = auVar21._0_4_ & 0x7fffffff;
    auVar21 = vucomiss_avx512f(auVar21);
    if ((((POPCOUNT(uVar20 + 0x80800000 & 0xff) & 1U) != 0) && (uVar20 < 0x7f800000)) &&
       ((auVar25 = vucomiss_avx512f(auVar25), uVar20 >= 0x7f800000 &&
        ((((bVar17 && (auVar18 = vucomiss_avx512f(auVar24), !bVar17)) &&
          ((uint)ABS(auVar23._0_4_) < 0x7f800000)) && ((auVar24._0_4_ & 0x7fffffff) < 0x7f800000))))
       )) {
      fVar3 = (this->m_right).super_dgTemplateVector<float>.m_x;
      fVar5 = (this->m_right).super_dgTemplateVector<float>.m_y;
      auVar24 = vmulss_avx512f(auVar29,ZEXT416((uint)fVar5));
      auVar24 = vfmadd231ss_avx512f(auVar24,ZEXT416((uint)fVar3),ZEXT416((uint)fVar35));
      fVar6 = (this->m_right).super_dgTemplateVector<float>.m_z;
      auVar24 = vfmadd231ss_avx512f(auVar24,ZEXT416((uint)fVar6),ZEXT416((uint)fVar4));
      fVar15 = (this->m_right).super_dgTemplateVector<float>.m_w;
      auVar26 = vfmadd231ss_avx512f(auVar24,ZEXT416((uint)fVar15),ZEXT416((uint)fVar33));
      auVar24 = vmulss_avx512f(auVar30,ZEXT416((uint)fVar5));
      auVar24 = vfmadd231ss_avx512f(auVar24,ZEXT416((uint)fVar3),ZEXT416((uint)fVar31));
      auVar24 = vfmadd231ss_avx512f(auVar24,ZEXT416((uint)fVar6),ZEXT416((uint)fVar7));
      auVar27 = vfmadd231ss_avx512f(auVar24,ZEXT416((uint)fVar15),ZEXT416((uint)fVar8));
      auVar24 = vmulss_avx512f(ZEXT416((uint)fVar10),ZEXT416((uint)fVar5));
      auVar24 = vfmadd231ss_avx512f(auVar24,ZEXT416((uint)fVar3),ZEXT416((uint)fVar9));
      auVar24 = vfmadd231ss_avx512f(auVar24,ZEXT416((uint)fVar6),ZEXT416((uint)fVar11));
      auVar28 = vfmadd231ss_avx512f(auVar24,ZEXT416((uint)fVar15),ZEXT416((uint)fVar12));
      auVar24 = vmulss_avx512f(ZEXT416((uint)fVar14),ZEXT416((uint)fVar5));
      auVar24 = vfmadd231ss_avx512f(auVar24,ZEXT416((uint)fVar13),ZEXT416((uint)fVar3));
      auVar24 = vfmadd231ss_avx512f(auVar24,ZEXT416((uint)fVar1),ZEXT416((uint)fVar6));
      auVar24 = vfmadd231ss_avx512f(auVar24,ZEXT416((uint)fVar2),ZEXT416((uint)fVar15));
      bVar17 = (auVar28._0_4_ & 0x7fffffff) < 0x7f800000;
      uVar20 = auVar24._0_4_ & 0x7fffffff;
      auVar24 = vucomiss_avx512f(auVar24);
      if ((((((POPCOUNT(uVar20 + 0x80800000 & 0xff) & 1U) != 0) && (uVar20 < 0x7f800000)) &&
           ((auVar28 = vucomiss_avx512f(auVar28), uVar20 >= 0x7f800000 &&
            ((bVar17 && (auVar19 = vucomiss_avx512f(auVar27), !bVar17)))))) &&
          ((uint)ABS(auVar26._0_4_) < 0x7f800000)) && ((auVar27._0_4_ & 0x7fffffff) < 0x7f800000)) {
        fVar3 = (this->m_posit).super_dgTemplateVector<float>.m_x;
        fVar5 = (this->m_posit).super_dgTemplateVector<float>.m_y;
        auVar29 = vmulss_avx512f(auVar29,ZEXT416((uint)fVar5));
        auVar29 = vfmadd213ss_avx512f(ZEXT416((uint)fVar35),ZEXT416((uint)fVar3),auVar29);
        fVar35 = (this->m_posit).super_dgTemplateVector<float>.m_z;
        auVar29 = vfmadd213ss_fma(ZEXT416((uint)fVar4),ZEXT416((uint)fVar35),auVar29);
        fVar4 = (this->m_posit).super_dgTemplateVector<float>.m_w;
        auVar29 = vfmadd213ss_fma(ZEXT416((uint)fVar33),ZEXT416((uint)fVar4),auVar29);
        auVar30 = vmulss_avx512f(auVar30,ZEXT416((uint)fVar5));
        auVar30 = vfmadd213ss_avx512f(ZEXT416((uint)fVar31),ZEXT416((uint)fVar3),auVar30);
        auVar30 = vfmadd213ss_fma(ZEXT416((uint)fVar7),ZEXT416((uint)fVar35),auVar30);
        auVar30 = vfmadd213ss_fma(ZEXT416((uint)fVar8),ZEXT416((uint)fVar4),auVar30);
        fVar31 = auVar30._0_4_;
        auVar30 = vmulss_avx512f(ZEXT416((uint)fVar10),ZEXT416((uint)fVar5));
        auVar30 = vfmadd213ss_avx512f(ZEXT416((uint)fVar9),ZEXT416((uint)fVar3),auVar30);
        auVar30 = vfmadd213ss_fma(ZEXT416((uint)fVar11),ZEXT416((uint)fVar35),auVar30);
        auVar30 = vfmadd213ss_fma(ZEXT416((uint)fVar12),ZEXT416((uint)fVar4),auVar30);
        fVar33 = auVar30._0_4_;
        auVar30 = vmulss_avx512f(ZEXT416((uint)fVar14),ZEXT416((uint)fVar5));
        auVar30 = vfmadd213ss_avx512f(ZEXT416((uint)fVar13),ZEXT416((uint)fVar3),auVar30);
        auVar30 = vfmadd213ss_avx512f(ZEXT416((uint)fVar1),ZEXT416((uint)fVar35),auVar30);
        auVar30 = vfmadd213ss_avx512f(ZEXT416((uint)fVar2),ZEXT416((uint)fVar4),auVar30);
        fVar35 = auVar30._0_4_;
        if (((((!NAN(fVar35)) && ((uint)ABS(fVar35) < 0x7f800000)) && (!NAN(fVar33))) &&
            (((uint)ABS(fVar33) < 0x7f800000 && (!NAN(fVar31))))) &&
           (((uint)ABS(auVar29._0_4_) < 0x7f800000 && ((uint)ABS(fVar31) < 0x7f800000)))) {
          (__return_storage_ptr__->m_front).super_dgTemplateVector<float>.m_x = auVar22._0_4_;
          (__return_storage_ptr__->m_front).super_dgTemplateVector<float>.m_y = fVar32;
          (__return_storage_ptr__->m_front).super_dgTemplateVector<float>.m_z = fVar34;
          (__return_storage_ptr__->m_front).super_dgTemplateVector<float>.m_w = fVar36;
          (__return_storage_ptr__->m_up).super_dgTemplateVector<float>.m_x = auVar23._0_4_;
          (__return_storage_ptr__->m_up).super_dgTemplateVector<float>.m_y = auVar18._0_4_;
          (__return_storage_ptr__->m_up).super_dgTemplateVector<float>.m_z = auVar25._0_4_;
          (__return_storage_ptr__->m_up).super_dgTemplateVector<float>.m_w = auVar21._0_4_;
          (__return_storage_ptr__->m_right).super_dgTemplateVector<float>.m_x = auVar26._0_4_;
          (__return_storage_ptr__->m_right).super_dgTemplateVector<float>.m_y = auVar19._0_4_;
          (__return_storage_ptr__->m_right).super_dgTemplateVector<float>.m_z = auVar28._0_4_;
          (__return_storage_ptr__->m_right).super_dgTemplateVector<float>.m_w = auVar24._0_4_;
          (__return_storage_ptr__->m_posit).super_dgTemplateVector<float>.m_x = auVar29._0_4_;
          (__return_storage_ptr__->m_posit).super_dgTemplateVector<float>.m_y = fVar31;
          (__return_storage_ptr__->m_posit).super_dgTemplateVector<float>.m_z = fVar33;
          (__return_storage_ptr__->m_posit).super_dgTemplateVector<float>.m_w = fVar35;
          return __return_storage_ptr__;
        }
      }
    }
  }
  __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                ,0x134,"dgVector::dgVector(hacd::HaF32, hacd::HaF32, hacd::HaF32, hacd::HaF32)");
}

Assistant:

dgMatrix dgMatrix::operator* (const dgMatrix &B) const
{
	const dgMatrix& A = *this;
	return dgMatrix (dgVector (A[0][0] * B[0][0] + A[0][1] * B[1][0] + A[0][2] * B[2][0] + A[0][3] * B[3][0],
							   A[0][0] * B[0][1] + A[0][1] * B[1][1] + A[0][2] * B[2][1] + A[0][3] * B[3][1],
							   A[0][0] * B[0][2] + A[0][1] * B[1][2] + A[0][2] * B[2][2] + A[0][3] * B[3][2],
							   A[0][0] * B[0][3] + A[0][1] * B[1][3] + A[0][2] * B[2][3] + A[0][3] * B[3][3]),
					 dgVector (A[1][0] * B[0][0] + A[1][1] * B[1][0] + A[1][2] * B[2][0] + A[1][3] * B[3][0],
							   A[1][0] * B[0][1] + A[1][1] * B[1][1] + A[1][2] * B[2][1] + A[1][3] * B[3][1],
							   A[1][0] * B[0][2] + A[1][1] * B[1][2] + A[1][2] * B[2][2] + A[1][3] * B[3][2],
							   A[1][0] * B[0][3] + A[1][1] * B[1][3] + A[1][2] * B[2][3] + A[1][3] * B[3][3]),
					 dgVector (A[2][0] * B[0][0] + A[2][1] * B[1][0] + A[2][2] * B[2][0] + A[2][3] * B[3][0],
							   A[2][0] * B[0][1] + A[2][1] * B[1][1] + A[2][2] * B[2][1] + A[2][3] * B[3][1],
							   A[2][0] * B[0][2] + A[2][1] * B[1][2] + A[2][2] * B[2][2] + A[2][3] * B[3][2],
							   A[2][0] * B[0][3] + A[2][1] * B[1][3] + A[2][2] * B[2][3] + A[2][3] * B[3][3]),
					 dgVector (A[3][0] * B[0][0] + A[3][1] * B[1][0] + A[3][2] * B[2][0] + A[3][3] * B[3][0],
							   A[3][0] * B[0][1] + A[3][1] * B[1][1] + A[3][2] * B[2][1] + A[3][3] * B[3][1],
							   A[3][0] * B[0][2] + A[3][1] * B[1][2] + A[3][2] * B[2][2] + A[3][3] * B[3][2],
							   A[3][0] * B[0][3] + A[3][1] * B[1][3] + A[3][2] * B[2][3] + A[3][3] * B[3][3]));
}